

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4minput.c
# Opt level: O0

int y4m_input_fetch_frame(y4m_input *_y4m,FILE *_fin,aom_image_t *_img)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int *in_RDX;
  int *in_RDI;
  bool bVar7;
  int j;
  char c;
  int bytes_per_sample;
  int c_sz;
  int c_h;
  int c_w;
  int pic_sz;
  size_t in_stack_00000020;
  char frame [6];
  int local_44;
  char local_3d;
  undefined1 local_26 [5];
  char local_21;
  int *local_20;
  int *local_10;
  int local_4;
  
  iVar3 = 1;
  if (8 < (uint)in_RDI[0x20]) {
    iVar3 = 2;
  }
  local_20 = in_RDX;
  local_10 = in_RDI;
  iVar4 = file_read(_img,in_stack_00000020,_c_w);
  if (iVar4 == 0) {
    local_4 = 0;
  }
  else {
    iVar4 = memcmp(local_26,"FRAME",5);
    if (iVar4 == 0) {
      if (local_21 != '\n') {
        local_44 = 0;
        while( true ) {
          bVar7 = false;
          if (local_44 < 0x4f) {
            iVar4 = file_read(_img,in_stack_00000020,_c_w);
            bVar7 = false;
            if (iVar4 != 0) {
              bVar7 = local_3d != '\n';
            }
          }
          if (!bVar7) break;
          local_44 = local_44 + 1;
        }
        if (local_44 == 0x4f) {
          fprintf(_stderr,"Error parsing Y4M frame header\n");
          return -1;
        }
      }
      iVar4 = file_read(_img,in_stack_00000020,_c_w);
      if (iVar4 == 0) {
        fprintf(_stderr,"Error reading Y4M frame data.\n");
        local_4 = -1;
      }
      else {
        iVar4 = file_read(_img,in_stack_00000020,_c_w);
        if (iVar4 == 0) {
          fprintf(_stderr,"Error reading Y4M frame data.\n");
          local_4 = -1;
        }
        else {
          (**(code **)(local_10 + 0x18))
                    (local_10,*(undefined8 *)(local_10 + 0x1a),*(undefined8 *)(local_10 + 0x1c));
          memset(local_20,0,0xa8);
          *local_20 = local_10[0x1e];
          iVar4 = *local_10;
          local_20[10] = iVar4;
          local_20[7] = iVar4;
          iVar4 = local_10[1];
          local_20[0xb] = iVar4;
          local_20[8] = iVar4;
          local_20[9] = local_10[0x20];
          local_20[0xe] = local_10[9] >> 1;
          local_20[0xf] = local_10[10] >> 1;
          local_20[0x1c] = local_10[0x1f];
          iVar5 = *local_10 * local_10[1] * iVar3;
          iVar6 = iVar3 * ((*local_10 + local_10[9] + -1) / local_10[9]);
          iVar4 = local_10[1];
          iVar1 = local_10[10];
          iVar2 = local_10[10];
          local_20[0x16] = *local_10 * iVar3;
          local_20[0x18] = iVar6;
          local_20[0x17] = iVar6;
          *(undefined8 *)(local_20 + 0x10) = *(undefined8 *)(local_10 + 0x1a);
          *(long *)(local_20 + 0x12) = *(long *)(local_10 + 0x1a) + (long)iVar5;
          *(long *)(local_20 + 0x14) =
               *(long *)(local_10 + 0x1a) + (long)iVar5 +
               (long)(iVar6 * ((iVar4 + iVar1 + -1) / iVar2));
          local_4 = 1;
        }
      }
    }
    else {
      fprintf(_stderr,"Loss of framing in Y4M input data\n");
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int y4m_input_fetch_frame(y4m_input *_y4m, FILE *_fin, aom_image_t *_img) {
  char frame[6];
  int pic_sz;
  int c_w;
  int c_h;
  int c_sz;
  int bytes_per_sample = _y4m->bit_depth > 8 ? 2 : 1;
  /*Read and skip the frame header.*/
  if (!file_read(frame, 6, _fin)) return 0;
  if (memcmp(frame, "FRAME", 5)) {
    fprintf(stderr, "Loss of framing in Y4M input data\n");
    return -1;
  }
  if (frame[5] != '\n') {
    char c;
    int j;
    for (j = 0; j < 79 && file_read(&c, 1, _fin) && c != '\n'; j++) {
    }
    if (j == 79) {
      fprintf(stderr, "Error parsing Y4M frame header\n");
      return -1;
    }
  }
  /*Read the frame data that needs no conversion.*/
  if (!file_read(_y4m->dst_buf, _y4m->dst_buf_read_sz, _fin)) {
    fprintf(stderr, "Error reading Y4M frame data.\n");
    return -1;
  }
  /*Read the frame data that does need conversion.*/
  if (!file_read(_y4m->aux_buf, _y4m->aux_buf_read_sz, _fin)) {
    fprintf(stderr, "Error reading Y4M frame data.\n");
    return -1;
  }
  /*Now convert the just read frame.*/
  (*_y4m->convert)(_y4m, _y4m->dst_buf, _y4m->aux_buf);
  /*Fill in the frame buffer pointers.
    We don't use aom_img_wrap() because it forces padding for odd picture
     sizes, which would require a separate fread call for every row.*/
  memset(_img, 0, sizeof(*_img));
  /*Y4M has the planes in Y'CbCr order, which libaom calls Y, U, and V.*/
  _img->fmt = _y4m->aom_fmt;
  _img->w = _img->d_w = _y4m->pic_w;
  _img->h = _img->d_h = _y4m->pic_h;
  _img->bit_depth = _y4m->bit_depth;
  _img->x_chroma_shift = _y4m->dst_c_dec_h >> 1;
  _img->y_chroma_shift = _y4m->dst_c_dec_v >> 1;
  _img->bps = _y4m->bps;

  /*Set up the buffer pointers.*/
  pic_sz = _y4m->pic_w * _y4m->pic_h * bytes_per_sample;
  c_w = (_y4m->pic_w + _y4m->dst_c_dec_h - 1) / _y4m->dst_c_dec_h;
  c_w *= bytes_per_sample;
  c_h = (_y4m->pic_h + _y4m->dst_c_dec_v - 1) / _y4m->dst_c_dec_v;
  c_sz = c_w * c_h;
  _img->stride[AOM_PLANE_Y] = _y4m->pic_w * bytes_per_sample;
  _img->stride[AOM_PLANE_U] = _img->stride[AOM_PLANE_V] = c_w;
  _img->planes[AOM_PLANE_Y] = _y4m->dst_buf;
  _img->planes[AOM_PLANE_U] = _y4m->dst_buf + pic_sz;
  _img->planes[AOM_PLANE_V] = _y4m->dst_buf + pic_sz + c_sz;
  return 1;
}